

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QMainWindowTabBar * __thiscall
QMainWindowLayout::findTabBar(QMainWindowLayout *this,QDockWidget *dockWidget)

{
  long lVar1;
  bool bVar2;
  QMainWindowTabBar *this_00;
  QTabBar **ppQVar3;
  long in_RDI;
  long in_FS_OFFSET;
  QMainWindowTabBar *tabBar;
  QTabBar *bar;
  QSet<QTabBar_*> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  const_iterator *in_stack_ffffffffffffff98;
  const_iterator *in_stack_ffffffffffffffa0;
  QMainWindowTabBar *local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QMainWindowTabBar *)(in_RDI + 0x718);
  QSet<QTabBar_*>::begin((QSet<QTabBar_*> *)this_00);
  QSet<QTabBar_*>::end((QSet<QTabBar_*> *)this_00);
  while (bVar2 = QSet<QTabBar_*>::const_iterator::operator!=
                           (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98), bVar2) {
    ppQVar3 = QSet<QTabBar_*>::const_iterator::operator*((const_iterator *)0x5f722c);
    local_30 = (QMainWindowTabBar *)*ppQVar3;
    bVar2 = QMainWindowTabBar::contains(this_00,(QDockWidget *)local_30);
    if (bVar2) goto LAB_005f7276;
    QSet<QTabBar_*>::const_iterator::operator++(in_stack_ffffffffffffffa0);
  }
  local_30 = (QMainWindowTabBar *)0x0;
LAB_005f7276:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_30;
}

Assistant:

QMainWindowTabBar *QMainWindowLayout::findTabBar(const QDockWidget *dockWidget) const
{
     for (auto *bar : usedTabBars) {
        Q_ASSERT(qobject_cast<QMainWindowTabBar *>(bar));
        auto *tabBar = static_cast<QMainWindowTabBar *>(bar);
        if (tabBar->contains(dockWidget))
            return tabBar;
    }
    return nullptr;
}